

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxScript.cpp
# Opt level: O1

void __thiscall Jinx::Impl::Script::SetVariableAtIndex(Script *this,RuntimeID id,size_t index)

{
  pointer pIVar1;
  ulong uVar2;
  pointer pIVar3;
  size_t local_18;
  RuntimeID local_10;
  unsigned_long local_8;
  
  uVar2 = ((long)(this->m_stack).
                 super__Vector_base<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_stack).
                 super__Vector_base<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
  local_18 = index;
  local_10 = id;
  if (uVar2 < index || uVar2 - index == 0) {
    __assert_fail("index < m_stack.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxScript.cpp"
                  ,0x4bf,"void Jinx::Impl::Script::SetVariableAtIndex(RuntimeID, size_t)");
  }
  pIVar1 = (this->m_idIndexData).
           super__Vector_base<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while ((pIVar3 = pIVar1,
         pIVar3 != (this->m_idIndexData).
                   super__Vector_base<Jinx::Impl::Script::IdIndexData,_Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,_4096UL,_16UL>_>
                   ._M_impl.super__Vector_impl_data._M_start &&
         ((ulong)((long)(this->m_execution).
                        super__Vector_base<Jinx::Impl::Script::ExecutionFrame,_Jinx::StaticAllocator<Jinx::Impl::Script::ExecutionFrame,_4096UL,_16UL>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->m_execution).
                        super__Vector_base<Jinx::Impl::Script::ExecutionFrame,_Jinx::StaticAllocator<Jinx::Impl::Script::ExecutionFrame,_4096UL,_16UL>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 6) <= pIVar3[-1].frameIndex)))
  {
    pIVar1 = pIVar3 + -1;
    if (pIVar3[-1].id == id) {
      pIVar3[-1].index = index;
      return;
    }
  }
  local_8 = (long)(this->m_execution).
                  super__Vector_base<Jinx::Impl::Script::ExecutionFrame,_Jinx::StaticAllocator<Jinx::Impl::Script::ExecutionFrame,_4096UL,_16UL>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->m_execution).
                  super__Vector_base<Jinx::Impl::Script::ExecutionFrame,_Jinx::StaticAllocator<Jinx::Impl::Script::ExecutionFrame,_4096UL,_16UL>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 6;
  std::
  vector<Jinx::Impl::Script::IdIndexData,Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,4096ul,16ul>>
  ::emplace_back<unsigned_long&,unsigned_long&,unsigned_long>
            ((vector<Jinx::Impl::Script::IdIndexData,Jinx::StaticAllocator<Jinx::Impl::Script::IdIndexData,4096ul,16ul>>
              *)&this->m_idIndexData,&local_10,&local_18,&local_8);
  return;
}

Assistant:

inline_t void Script::SetVariableAtIndex(RuntimeID id, size_t index)
	{
		assert(index < m_stack.size());
		for (auto ritr = m_idIndexData.rbegin(); ritr != m_idIndexData.rend(); ++ritr)
		{
			if (ritr->frameIndex < m_execution.size())
				break;
			if (ritr->id == id)
			{
				ritr->index = index;
				return;
			}
		}
		m_idIndexData.emplace_back(id, index, m_execution.size());
	}